

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::write_access_chain_array
          (CompilerHLSL *this,SPIRAccessChain *chain,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain)

{
  AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pAVar1;
  pointer pcVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  uint uVar5;
  char (*in_R8) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  uint32_t id;
  uint32_t local_2a8;
  uint32_t int_type_id;
  SmallVector<unsigned_int,_8UL> *local_2a0;
  string ident;
  SmallVector<unsigned_int,_8UL> subcomposite_chain;
  SPIRAccessChain subchain;
  SPIRType int_type;
  
  local_2a0 = composite_chain;
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(chain->super_IVariant).field_0xc);
  if (pSVar4->pointer == true) {
    do {
      pSVar4 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + pSVar4->basetype);
    } while (pSVar4->pointer != false);
  }
  uVar3 = this->unique_identifier_count;
  this->unique_identifier_count = uVar3 + 1;
  int_type.super_IVariant._vptr_IVariant =
       (_func_int **)CONCAT44(int_type.super_IVariant._vptr_IVariant._4_4_,uVar3);
  join<char_const(&)[2],unsigned_int,char_const(&)[6]>
            (&ident,(spirv_cross *)0x2c1f55,(char (*) [2])&int_type,(uint *)"ident",in_R8);
  id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
  int_type_id = id + 1;
  int_type.array.super_VectorView<unsigned_int>.ptr = (uint *)&int_type.array.stack_storage;
  int_type.super_IVariant.self.id = 0;
  int_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00360128;
  int_type.super_IVariant._12_4_ = 0x15;
  int_type.vecsize = 1;
  int_type.columns = 1;
  int_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  int_type.array.buffer_capacity = 8;
  int_type.array_size_literal.super_VectorView<bool>.ptr =
       (bool *)&int_type.array_size_literal.stack_storage;
  int_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  int_type.array_size_literal.buffer_capacity = 8;
  int_type.pointer_depth = 0;
  int_type.pointer = false;
  int_type.forward_pointer = false;
  int_type.cooperative.use_id = 0;
  int_type.cooperative.rows_id = 0;
  int_type.cooperative.columns_id = 0;
  int_type.cooperative.scope_id = 0;
  int_type.storage = StorageClassGeneric;
  int_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&int_type.member_types.stack_storage;
  int_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
       0;
  int_type.member_types.buffer_capacity = 8;
  int_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
       (uint *)&int_type.member_type_index_redirection.stack_storage;
  int_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  int_type.member_type_index_redirection.buffer_capacity = 8;
  int_type.member_name_cache._M_h._M_buckets = &int_type.member_name_cache._M_h._M_single_bucket;
  int_type.image._0_7_ = 0;
  int_type.image._7_4_ = 0;
  int_type.parent_type.id = 0;
  int_type.image.sampled = 0;
  int_type.image.format = ImageFormatUnknown;
  int_type.image.access = AccessQualifierReadOnly;
  int_type.type_alias.id = 0;
  int_type.member_name_cache._M_h._M_bucket_count = 1;
  int_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  int_type.member_name_cache._M_h._M_element_count = 0;
  int_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  int_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  int_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  int_type.basetype = Int;
  int_type.width = 0x20;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,int_type_id,&int_type);
  subchain.super_IVariant._vptr_IVariant =
       (_func_int **)CONCAT71(subchain.super_IVariant._vptr_IVariant._1_7_,1);
  Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string&,unsigned_int&,bool>
            ((Compiler *)this,id,&ident,&int_type_id,(bool *)&subchain);
  Compiler::set_name((Compiler *)this,(ID)id,&ident);
  subchain.super_IVariant._vptr_IVariant =
       (_func_int **)&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)subchain.super_IVariant._vptr_IVariant,&id);
  CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[unroll]");
  CompilerGLSL::to_array_size_abi_cxx11_
            ((string *)&subchain,&this->super_CompilerGLSL,pSVar4,
             (int)(pSVar4->array).super_VectorView<unsigned_int>.buffer_size - 1);
  CompilerGLSL::
  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [10])"for (int ",&ident,(char (*) [7])" = 0; ",
             &ident,(char (*) [4])" < ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subchain,
             (char (*) [3])0x2c2279,&ident,(char (*) [4])0x2bdc9d);
  if (subchain.super_IVariant._vptr_IVariant != (_func_int **)&subchain.storage) {
    operator_delete(subchain.super_IVariant._vptr_IVariant);
  }
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  subchain.super_IVariant.self.id = (chain->super_IVariant).self.id;
  subchain.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_00360220;
  subchain._12_8_ = *(undefined8 *)&(chain->super_IVariant).field_0xc;
  subchain.base._M_dataplus._M_p = (pointer)&subchain.base.field_2;
  pcVar2 = (chain->base)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&subchain.base,pcVar2,pcVar2 + (chain->base)._M_string_length);
  subchain.dynamic_index._M_dataplus._M_p = (pointer)&subchain.dynamic_index.field_2;
  pcVar2 = (chain->dynamic_index)._M_dataplus._M_p;
  local_2a8 = value;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&subchain.dynamic_index,pcVar2,
             pcVar2 + (chain->dynamic_index)._M_string_length);
  subchain.row_major_matrix = chain->row_major_matrix;
  subchain.immutable = chain->immutable;
  subchain.static_index = chain->static_index;
  subchain.loaded_from.id = (chain->loaded_from).id;
  subchain.matrix_stride = chain->matrix_stride;
  subchain.array_stride = chain->array_stride;
  pAVar1 = &subchain.implied_read_expressions.stack_storage;
  subchain.implied_read_expressions.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  subchain.implied_read_expressions.buffer_capacity = 8;
  subchain.implied_read_expressions.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)pAVar1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&subchain.implied_read_expressions,&chain->implied_read_expressions);
  join<std::__cxx11::string&,char_const(&)[4],unsigned_int_const&,char_const(&)[4],std::__cxx11::string_const&>
            ((string *)&subcomposite_chain,(spirv_cross *)&ident,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d6c93,
             (char (*) [4])&chain->array_stride,(uint *)0x2ca8d4,(char (*) [4])&chain->dynamic_index
             ,in_stack_fffffffffffffd48);
  ::std::__cxx11::string::operator=((string *)&subchain.dynamic_index,(string *)&subcomposite_chain)
  ;
  if ((size_t *)subcomposite_chain.super_VectorView<unsigned_int>.ptr !=
      &subcomposite_chain.buffer_capacity) {
    operator_delete(subcomposite_chain.super_VectorView<unsigned_int>.ptr);
  }
  subchain.super_IVariant._12_4_ = (pSVar4->parent_type).id;
  subcomposite_chain.super_VectorView<unsigned_int>.buffer_size = 0;
  subcomposite_chain.buffer_capacity = 8;
  subcomposite_chain.super_VectorView<unsigned_int>.ptr = (uint *)&subcomposite_chain.stack_storage;
  SmallVector<unsigned_int,_8UL>::operator=(&subcomposite_chain,local_2a0);
  uVar5 = id | 0x80000000;
  SmallVector<unsigned_int,_8UL>::reserve
            (&subcomposite_chain,subcomposite_chain.super_VectorView<unsigned_int>.buffer_size + 1);
  subcomposite_chain.super_VectorView<unsigned_int>.ptr
  [subcomposite_chain.super_VectorView<unsigned_int>.buffer_size] = uVar5;
  subcomposite_chain.super_VectorView<unsigned_int>.buffer_size =
       subcomposite_chain.super_VectorView<unsigned_int>.buffer_size + 1;
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (subchain._12_8_ & 0xffffffff));
  if ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    uVar3 = Compiler::get_decoration
                      ((Compiler *)this,(ID)subchain.super_IVariant._12_4_,DecorationArrayStride);
    subchain.array_stride = uVar3;
  }
  write_access_chain(this,&subchain,local_2a8,&subcomposite_chain);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  subcomposite_chain.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)subcomposite_chain.super_VectorView<unsigned_int>.ptr !=
      &subcomposite_chain.stack_storage) {
    free(subcomposite_chain.super_VectorView<unsigned_int>.ptr);
  }
  subchain.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_00360220;
  subchain.implied_read_expressions.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
      subchain.implied_read_expressions.
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr != pAVar1) {
    free(subchain.implied_read_expressions.
         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)subchain.dynamic_index._M_dataplus._M_p != &subchain.dynamic_index.field_2) {
    operator_delete(subchain.dynamic_index._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)subchain.base._M_dataplus._M_p != &subchain.base.field_2) {
    operator_delete(subchain.base._M_dataplus._M_p);
  }
  int_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00360128;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&int_type.member_name_cache._M_h);
  int_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      int_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &int_type.member_type_index_redirection.stack_storage) {
    free(int_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  int_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
       0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      int_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &int_type.member_types.stack_storage) {
    free(int_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
  }
  int_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)int_type.array_size_literal.super_VectorView<bool>.ptr !=
      &int_type.array_size_literal.stack_storage) {
    free(int_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  int_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)int_type.array.super_VectorView<unsigned_int>.ptr !=
      &int_type.array.stack_storage) {
    free(int_type.array.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ident._M_dataplus._M_p != &ident.field_2) {
    operator_delete(ident._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::write_access_chain_array(const SPIRAccessChain &chain, uint32_t value,
                                            const SmallVector<uint32_t> &composite_chain)
{
	auto *ptype = &get<SPIRType>(chain.basetype);
	while (ptype->pointer)
	{
		ptype = &get<SPIRType>(ptype->basetype);
	}
	auto &type = *ptype;

	// Need to use a reserved identifier here since it might shadow an identifier in the access chain input or other loops.
	auto ident = get_unique_identifier();

	uint32_t id = ir.increase_bound_by(2);
	uint32_t int_type_id = id + 1;
	SPIRType int_type { OpTypeInt };
	int_type.basetype = SPIRType::Int;
	int_type.width = 32;
	set<SPIRType>(int_type_id, int_type);
	set<SPIRExpression>(id, ident, int_type_id, true);
	set_name(id, ident);
	suppressed_usage_tracking.insert(id);

	statement("[unroll]");
	statement("for (int ", ident, " = 0; ", ident, " < ", to_array_size(type, uint32_t(type.array.size() - 1)), "; ",
	          ident, "++)");
	begin_scope();
	auto subchain = chain;
	subchain.dynamic_index = join(ident, " * ", chain.array_stride, " + ", chain.dynamic_index);
	subchain.basetype = type.parent_type;

	// Forcefully allow us to use an ID here by setting MSB.
	auto subcomposite_chain = composite_chain;
	subcomposite_chain.push_back(0x80000000u | id);

	if (!get<SPIRType>(subchain.basetype).array.empty())
		subchain.array_stride = get_decoration(subchain.basetype, DecorationArrayStride);

	write_access_chain(subchain, value, subcomposite_chain);
	end_scope();
}